

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

int pushXFStack(xformDatabase *xdb,matrix4 *ctm)

{
  matrix4 *ctm_local;
  xformDatabase *xdb_local;
  
  if ((xdb->nstack < 1) || (7 < xdb->nstack)) {
    xdb_local._4_4_ = 0;
  }
  else {
    xdb->nstack = xdb->nstack + 1;
    memcpy(xdb->ctmstack[xdb->nstack + -1],ctm,0x80);
    xdb_local._4_4_ = 1;
  }
  return xdb_local._4_4_;
}

Assistant:

int pushXFStack(xformDatabase* xdb, matrix4* ctm) {
   if (xdb->nstack > 0 && xdb->nstack < MAX_XFORM_STACK_DEPTH) {
      xdb->nstack++;
      *(xdb->ctmstack[xdb->nstack - 1]) = *ctm;
      return TRUE;
   }
   else {
      return FALSE;
   }
}